

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

void __thiscall
cmCommandArgumentParserHelper::cmCommandArgumentParserHelper(cmCommandArgumentParserHelper *this)

{
  cmCommandArgumentParserHelper *this_local;
  
  std::__cxx11::string::string((string *)&this->InputBuffer);
  std::vector<char,_std::allocator<char>_>::vector(&this->OutputBuffer);
  std::vector<char_*,_std::allocator<char_*>_>::vector(&this->Variables);
  std::__cxx11::string::string((string *)&this->Result);
  std::__cxx11::string::string((string *)&this->ErrorString);
  this->WarnUninitialized = false;
  this->CheckSystemVars = false;
  this->FileLine = -1;
  this->FileName = (char *)0x0;
  this->RemoveEmpty = true;
  this->EmptyVariable[0] = '\0';
  strcpy(this->DCURLYVariable,"${");
  strcpy(this->RCURLYVariable,"}");
  strcpy(this->ATVariable,"@");
  strcpy(this->DOLLARVariable,"$");
  strcpy(this->LCURLYVariable,"{");
  strcpy(this->BSLASHVariable,"\\");
  this->NoEscapeMode = false;
  this->ReplaceAtSyntax = false;
  return;
}

Assistant:

cmCommandArgumentParserHelper::cmCommandArgumentParserHelper()
{
  this->WarnUninitialized = false;
  this->CheckSystemVars = false;
  this->FileLine = -1;
  this->FileName = CM_NULLPTR;
  this->RemoveEmpty = true;
  this->EmptyVariable[0] = 0;
  strcpy(this->DCURLYVariable, "${");
  strcpy(this->RCURLYVariable, "}");
  strcpy(this->ATVariable, "@");
  strcpy(this->DOLLARVariable, "$");
  strcpy(this->LCURLYVariable, "{");
  strcpy(this->BSLASHVariable, "\\");

  this->NoEscapeMode = false;
  this->ReplaceAtSyntax = false;
}